

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkInvertConstraints(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  
  if (pNtk->nConstrs != 0) {
    pVVar3 = pNtk->vPos;
    uVar4 = (ulong)(uint)pVVar3->nSize;
    if (0 < pVVar3->nSize) {
      lVar2 = 0;
      do {
        if ((long)(int)uVar4 - (long)pNtk->nConstrs <= lVar2) {
          puVar1 = (uint *)((long)pVVar3->pArray[lVar2] + 0x14);
          *puVar1 = *puVar1 ^ 0x400;
        }
        lVar2 = lVar2 + 1;
        pVVar3 = pNtk->vPos;
        uVar4 = (ulong)pVVar3->nSize;
      } while (lVar2 < (long)uVar4);
    }
  }
  return;
}

Assistant:

void Abc_NtkInvertConstraints( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkConstrNum(pNtk) == 0 )
        return;
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
            Abc_ObjXorFaninC( pObj, 0 );
    }
}